

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O1

void __thiscall Cleaner::DoCleanRule(Cleaner *this,Rule *rule)

{
  Edge *pEVar1;
  Rule *pRVar2;
  size_t __n;
  int iVar3;
  pointer ppNVar4;
  pointer ppEVar5;
  
  if (rule != (Rule *)0x0) {
    ppEVar5 = (this->state_->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppEVar5 !=
        (this->state_->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pEVar1 = *ppEVar5;
        pRVar2 = pEVar1->rule_;
        __n = (pRVar2->name_)._M_string_length;
        if ((__n == (rule->name_)._M_string_length) &&
           ((__n == 0 ||
            (iVar3 = bcmp((pRVar2->name_)._M_dataplus._M_p,(rule->name_)._M_dataplus._M_p,__n),
            iVar3 == 0)))) {
          for (ppNVar4 = (pEVar1->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              ppNVar4 !=
              ((*ppEVar5)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppNVar4 = ppNVar4 + 1) {
            Remove(this,&(*ppNVar4)->env_path_);
            RemoveEdgeFiles(this,*ppEVar5);
          }
        }
        ppEVar5 = ppEVar5 + 1;
      } while (ppEVar5 !=
               (this->state_->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    return;
  }
  __assert_fail("rule",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean.cc"
                ,0xc9,"void Cleaner::DoCleanRule(const Rule *)");
}

Assistant:

void Cleaner::DoCleanRule(const Rule* rule) {
  assert(rule);

  for (vector<Edge*>::iterator e = state_->edges_.begin();
       e != state_->edges_.end(); ++e) {
    if ((*e)->rule().name() == rule->name()) {
      for (vector<Node*>::iterator out_node = (*e)->outputs_.begin();
           out_node != (*e)->outputs_.end(); ++out_node) {
        Remove((*out_node)->path());
        RemoveEdgeFiles(*e);
      }
    }
  }
}